

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.cc
# Opt level: O3

size_type __thiscall wabt::string_view::find_first_of(string_view *this,char *s,size_type pos)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  
  sVar2 = strlen(s);
  if (pos < this->size_) {
    pcVar1 = this->data_;
    pcVar3 = pcVar1 + pos;
    do {
      if (sVar2 != 0) {
        sVar4 = 0;
        do {
          if (*pcVar3 == s[sVar4]) {
            if (pcVar3 == pcVar1 + this->size_) {
              return 0xffffffffffffffff;
            }
            return (long)pcVar3 - (long)pcVar1;
          }
          sVar4 = sVar4 + 1;
        } while (sVar2 != sVar4);
      }
      pcVar3 = pcVar3 + 1;
    } while (pcVar3 != pcVar1 + this->size_);
  }
  return 0xffffffffffffffff;
}

Assistant:

string_view::size_type string_view::find_first_of(const char* s,
                                                  size_type pos) const {
  return find_first_of(string_view(s), pos);
}